

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jacobi.h
# Opt level: O2

void __thiscall
Eigen::JacobiRotation<double>::makeGivens
          (JacobiRotation<double> *this,double *p,double *q,double *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = *q;
  dVar3 = *p;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      if (ABS(dVar3) <= ABS(dVar2)) {
        dVar3 = dVar3 / dVar2;
        dVar1 = SQRT(dVar3 * dVar3 + 1.0);
        dVar1 = (double)((ulong)-dVar1 & -(ulong)(dVar2 < 0.0) |
                        ~-(ulong)(dVar2 < 0.0) & (ulong)dVar1);
        dVar2 = -1.0 / dVar1;
        this->m_s = dVar2;
        this->m_c = -dVar3 * dVar2;
        if (r == (double *)0x0) {
          return;
        }
        dVar1 = dVar1 * *q;
      }
      else {
        dVar2 = dVar2 / dVar3;
        dVar1 = SQRT(dVar2 * dVar2 + 1.0);
        dVar1 = (double)((ulong)-dVar1 & -(ulong)(dVar3 < 0.0) |
                        ~-(ulong)(dVar3 < 0.0) & (ulong)dVar1);
        dVar3 = 1.0 / dVar1;
        this->m_c = dVar3;
        this->m_s = -dVar2 * dVar3;
        if (r == (double *)0x0) {
          return;
        }
        dVar1 = dVar1 * *p;
      }
      goto LAB_0014a740;
    }
    this->m_c = 0.0;
    this->m_s = *(double *)(&DAT_0015a750 + (ulong)(*q <= 0.0 && *q != 0.0) * 8);
    if (r == (double *)0x0) {
      return;
    }
    dVar1 = *q;
  }
  else {
    this->m_c = *(double *)(&DAT_0015a760 + (ulong)(dVar3 < 0.0) * 8);
    this->m_s = 0.0;
    if (r == (double *)0x0) {
      return;
    }
    dVar1 = *p;
  }
  dVar1 = ABS(dVar1);
LAB_0014a740:
  *r = dVar1;
  return;
}

Assistant:

void JacobiRotation<Scalar>::makeGivens(const Scalar& p, const Scalar& q, Scalar* r, internal::false_type)
{
  using std::sqrt;
  using std::abs;
  if(q==Scalar(0))
  {
    m_c = p<Scalar(0) ? Scalar(-1) : Scalar(1);
    m_s = Scalar(0);
    if(r) *r = abs(p);
  }
  else if(p==Scalar(0))
  {
    m_c = Scalar(0);
    m_s = q<Scalar(0) ? Scalar(1) : Scalar(-1);
    if(r) *r = abs(q);
  }
  else if(abs(p) > abs(q))
  {
    Scalar t = q/p;
    Scalar u = sqrt(Scalar(1) + numext::abs2(t));
    if(p<Scalar(0))
      u = -u;
    m_c = Scalar(1)/u;
    m_s = -t * m_c;
    if(r) *r = p * u;
  }
  else
  {
    Scalar t = p/q;
    Scalar u = sqrt(Scalar(1) + numext::abs2(t));
    if(q<Scalar(0))
      u = -u;
    m_s = -Scalar(1)/u;
    m_c = -t * m_s;
    if(r) *r = q * u;
  }

}